

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

Status * google::protobuf::util::converter::ProtoWriter::WriteEnum
                   (Status *__return_storage_ptr__,int field_number,DataPiece *data,Enum *enum_type,
                   CodedOutputStream *stream,bool use_lower_camel_for_enums,
                   bool case_insensitive_enum_parsing,bool ignore_unknown_values)

{
  undefined1 local_60 [8];
  StatusOr<int> e;
  bool is_unknown_enum_value;
  
  e._47_1_ = 0;
  DataPiece::ToEnum((StatusOr<int> *)local_60,data,enum_type,use_lower_camel_for_enums,
                    case_insensitive_enum_parsing,ignore_unknown_values,(bool *)&e.field_0x2f);
  if ((local_60._0_4_ == OK) && (e._47_1_ == '\0')) {
    protobuf::internal::WireFormatLite::WriteEnum
              (field_number,e.status_.error_message_.field_2._8_4_,stream);
  }
  Status::Status(__return_storage_ptr__,(Status *)local_60);
  if ((size_type *)e.status_._0_8_ != &e.status_.error_message_._M_string_length) {
    operator_delete((void *)e.status_._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoWriter::WriteEnum(int field_number, const DataPiece& data,
                              const google::protobuf::Enum* enum_type,
                              CodedOutputStream* stream,
                              bool use_lower_camel_for_enums,
                              bool case_insensitive_enum_parsing,
                              bool ignore_unknown_values) {
  bool is_unknown_enum_value = false;
  StatusOr<int> e = data.ToEnum(enum_type, use_lower_camel_for_enums,
                                case_insensitive_enum_parsing,
                                ignore_unknown_values, &is_unknown_enum_value);
  if (e.ok() && !is_unknown_enum_value) {
    WireFormatLite::WriteEnum(field_number, e.value(), stream);
  }
  return e.status();
}